

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_auth(connectdata *conn,char *mech,char *initresp,size_t len,smtpstate state1,
                          smtpstate state2)

{
  size_t sVar1;
  smtp_conn *smtpc;
  CURLcode result;
  smtpstate state2_local;
  smtpstate state1_local;
  size_t len_local;
  char *initresp_local;
  char *mech_local;
  connectdata *conn_local;
  
  if ((initresp == (char *)0x0) || (sVar1 = strlen(mech), 0x200 < sVar1 + 8 + len)) {
    smtpc._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s",mech);
    if (smtpc._4_4_ == CURLE_OK) {
      state(conn,state1);
    }
  }
  else {
    smtpc._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s %s",mech,initresp);
    if (smtpc._4_4_ == CURLE_OK) {
      state(conn,state2);
    }
  }
  return smtpc._4_4_;
}

Assistant:

static CURLcode smtp_perform_auth(struct connectdata *conn,
                                  const char *mech,
                                  const char *initresp, size_t len,
                                  smtpstate state1, smtpstate state2)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  if(initresp && 8 + strlen(mech) + len <= 512) { /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(&smtpc->pp, "AUTH %s %s", mech, initresp);

    if(!result)
      state(conn, state2);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(&smtpc->pp, "AUTH %s", mech);

    if(!result)
      state(conn, state1);
  }

  return result;
}